

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void Test_DeathSTREQ_logging::RunTest(void)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  char *s1;
  ostream *poVar4;
  LogMessage local_140;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  CheckOpString local_e8;
  CheckOpString _result_6;
  _func_void *original_logging_fail_func_6;
  CheckOpString local_c8;
  CheckOpString _result_5;
  _func_void *original_logging_fail_func_5;
  CheckOpString local_a8;
  CheckOpString _result_4;
  _func_void *original_logging_fail_func_4;
  CheckOpString local_88;
  CheckOpString _result_3;
  _func_void *original_logging_fail_func_3;
  CheckOpString local_68;
  CheckOpString _result_2;
  _func_void *original_logging_fail_func_2;
  CheckOpString local_48;
  CheckOpString _result_1;
  _func_void *original_logging_fail_func_1;
  LogMessage local_28;
  CheckOpString local_18;
  CheckOpString _result;
  _func_void *original_logging_fail_func;
  
  google::g_called_abort = 0;
  _result.str_ = (string *)google::g_logging_fail_func;
  google::g_logging_fail_func = google::CalledAbort;
  iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
  if (iVar2 == 0) {
    psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_((char *)0x0,"this","__null == \"this\"");
    google::CheckOpString::CheckOpString(&local_18,psVar3);
    bVar1 = google::CheckOpString::operator_cast_to_bool(&local_18);
    if (bVar1) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x254);
      poVar4 = google::LogMessage::stream(&local_28);
      std::operator<<(poVar4,(string *)local_18.str_);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
    }
  }
  google::g_logging_fail_func = &(_result.str_)->_M_dataplus;
  if ((google::g_called_abort & 1) == 0) {
    fprintf(_stderr,"Function didn\'t die (%s): %s\n","","CHECK_STREQ(NULL, \"this\")");
    exit(1);
  }
  google::g_called_abort = 0;
  _result_1 = _result;
  google::g_logging_fail_func = google::CalledAbort;
  iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
  if (iVar2 == 0) {
    psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_("this","siht","\"this\" == \"siht\"");
    google::CheckOpString::CheckOpString(&local_48,psVar3);
    bVar1 = google::CheckOpString::operator_cast_to_bool(&local_48);
    if (bVar1) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&original_logging_fail_func_2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x255);
      poVar4 = google::LogMessage::stream((LogMessage *)&original_logging_fail_func_2);
      std::operator<<(poVar4,(string *)local_48.str_);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&original_logging_fail_func_2);
    }
  }
  google::g_logging_fail_func = &(_result_1.str_)->_M_dataplus;
  if ((google::g_called_abort & 1) == 0) {
    fprintf(_stderr,"Function didn\'t die (%s): %s\n","","CHECK_STREQ(\"this\", \"siht\")");
    exit(1);
  }
  google::g_called_abort = 0;
  _result_2 = _result_1;
  google::g_logging_fail_func = google::CalledAbort;
  iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
  if (iVar2 == 0) {
    psVar3 = google::CheckstrcasecmptrueImpl_abi_cxx11_((char *)0x0,"siht","__null == \"siht\"");
    google::CheckOpString::CheckOpString(&local_68,psVar3);
    bVar1 = google::CheckOpString::operator_cast_to_bool(&local_68);
    if (bVar1) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&original_logging_fail_func_3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x256);
      poVar4 = google::LogMessage::stream((LogMessage *)&original_logging_fail_func_3);
      std::operator<<(poVar4,(string *)local_68.str_);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&original_logging_fail_func_3);
    }
  }
  google::g_logging_fail_func = &(_result_2.str_)->_M_dataplus;
  if ((google::g_called_abort & 1) == 0) {
    fprintf(_stderr,"Function didn\'t die (%s): %s\n","","CHECK_STRCASEEQ(NULL, \"siht\")");
    exit(1);
  }
  google::g_called_abort = 0;
  _result_3 = _result_2;
  google::g_logging_fail_func = google::CalledAbort;
  iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
  if (iVar2 == 0) {
    psVar3 = google::CheckstrcasecmptrueImpl_abi_cxx11_("this","siht","\"this\" == \"siht\"");
    google::CheckOpString::CheckOpString(&local_88,psVar3);
    bVar1 = google::CheckOpString::operator_cast_to_bool(&local_88);
    if (bVar1) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&original_logging_fail_func_4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,599);
      poVar4 = google::LogMessage::stream((LogMessage *)&original_logging_fail_func_4);
      std::operator<<(poVar4,(string *)local_88.str_);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&original_logging_fail_func_4);
    }
  }
  google::g_logging_fail_func = &(_result_3.str_)->_M_dataplus;
  if ((google::g_called_abort & 1) != 0) {
    google::g_called_abort = 0;
    _result_4 = _result_3;
    google::g_logging_fail_func = google::CalledAbort;
    iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
    if (iVar2 == 0) {
      psVar3 = google::CheckstrcmpfalseImpl_abi_cxx11_((char *)0x0,(char *)0x0,"__null != __null");
      google::CheckOpString::CheckOpString(&local_a8,psVar3);
      bVar1 = google::CheckOpString::operator_cast_to_bool(&local_a8);
      if (bVar1) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&original_logging_fail_func_5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,600);
        poVar4 = google::LogMessage::stream((LogMessage *)&original_logging_fail_func_5);
        std::operator<<(poVar4,(string *)local_a8.str_);
        google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&original_logging_fail_func_5);
      }
    }
    google::g_logging_fail_func = &(_result_4.str_)->_M_dataplus;
    if ((google::g_called_abort & 1) == 0) {
      fprintf(_stderr,"Function didn\'t die (%s): %s\n","","CHECK_STRNE(NULL, NULL)");
      exit(1);
    }
    google::g_called_abort = 0;
    _result_5 = _result_4;
    google::g_logging_fail_func = google::CalledAbort;
    iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
    if (iVar2 == 0) {
      psVar3 = google::CheckstrcmpfalseImpl_abi_cxx11_("this","this","\"this\" != \"this\"");
      google::CheckOpString::CheckOpString(&local_c8,psVar3);
      bVar1 = google::CheckOpString::operator_cast_to_bool(&local_c8);
      if (bVar1) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&original_logging_fail_func_6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x259);
        poVar4 = google::LogMessage::stream((LogMessage *)&original_logging_fail_func_6);
        std::operator<<(poVar4,(string *)local_c8.str_);
        google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&original_logging_fail_func_6);
      }
    }
    google::g_logging_fail_func = &(_result_5.str_)->_M_dataplus;
    if ((google::g_called_abort & 1) != 0) {
      google::g_called_abort = 0;
      _result_6 = _result_5;
      google::g_logging_fail_func = google::CalledAbort;
      iVar2 = _setjmp((__jmp_buf_tag *)google::g_jmp_buf);
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"a",&local_129);
        std::operator+(&local_108,&local_128,"b");
        s1 = (char *)std::__cxx11::string::c_str();
        psVar3 = google::CheckstrcmptrueImpl_abi_cxx11_
                           (s1,"abc","(string(\"a\")+\"b\").c_str() == \"abc\"");
        google::CheckOpString::CheckOpString(&local_e8,psVar3);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator(&local_129);
        bVar1 = google::CheckOpString::operator_cast_to_bool(&local_e8);
        if (bVar1) {
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_140,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,0x25a);
          poVar4 = google::LogMessage::stream(&local_140);
          std::operator<<(poVar4,(string *)local_e8.str_);
          google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_140);
        }
      }
      google::g_logging_fail_func = &(_result_6.str_)->_M_dataplus;
      if ((google::g_called_abort & 1) != 0) {
        return;
      }
      fprintf(_stderr,"Function didn\'t die (%s): %s\n","",
              "CHECK_STREQ((string(\"a\")+\"b\").c_str(), \"abc\")");
      exit(1);
    }
    fprintf(_stderr,"Function didn\'t die (%s): %s\n","","CHECK_STRNE(\"this\", \"this\")");
    exit(1);
  }
  fprintf(_stderr,"Function didn\'t die (%s): %s\n","","CHECK_STRCASEEQ(\"this\", \"siht\")");
  exit(1);
}

Assistant:

TEST(DeathSTREQ, logging) {
  ASSERT_DEATH(CHECK_STREQ(NULL, "this"), "");
  ASSERT_DEATH(CHECK_STREQ("this", "siht"), "");
  ASSERT_DEATH(CHECK_STRCASEEQ(NULL, "siht"), "");
  ASSERT_DEATH(CHECK_STRCASEEQ("this", "siht"), "");
  ASSERT_DEATH(CHECK_STRNE(NULL, NULL), "");
  ASSERT_DEATH(CHECK_STRNE("this", "this"), "");
  ASSERT_DEATH(CHECK_STREQ((string("a")+"b").c_str(), "abc"), "");
}